

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitIteratorClose(RegSlot iteratorLocation,ByteCodeGenerator *byteCodeGenerator,
                      FuncInfo *funcInfo,bool isAsync)

{
  RegSlot methodReg;
  ByteCodeLabel noMethodLabel;
  undefined7 in_register_00000009;
  
  methodReg = FuncInfo::AcquireTmpRegister(funcInfo);
  noMethodLabel = Js::ByteCodeWriter::DefineLabel(&byteCodeGenerator->m_writer);
  EmitGetOptionalObjectMethod
            (methodReg,iteratorLocation,0x135,noMethodLabel,byteCodeGenerator,funcInfo);
  EmitFunctionCall(methodReg,methodReg,iteratorLocation,0xffffffff,byteCodeGenerator,funcInfo);
  if ((int)CONCAT71(in_register_00000009,isAsync) != 0) {
    EmitAwait(methodReg,methodReg,byteCodeGenerator,funcInfo);
  }
  EmitThrowOnNotObject(methodReg,byteCodeGenerator);
  FuncInfo::ReleaseTmpRegister(funcInfo,methodReg);
  Js::ByteCodeWriter::MarkLabel(&byteCodeGenerator->m_writer,noMethodLabel);
  return;
}

Assistant:

void EmitIteratorClose(
    Js::RegSlot iteratorLocation,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    bool isAsync)
{
    Js::RegSlot returnReg = funcInfo->AcquireTmpRegister();
    Js::ByteCodeLabel noReturn = byteCodeGenerator->Writer()->DefineLabel();

    EmitGetOptionalObjectMethod(
        returnReg,
        iteratorLocation,
        Js::PropertyIds::return_,
        noReturn,
        byteCodeGenerator,
        funcInfo);

    EmitFunctionCall(returnReg, returnReg, iteratorLocation, byteCodeGenerator, funcInfo);

    // In for-await or async yield* use await on the returned value
    if (isAsync)
        EmitAwait(returnReg, returnReg, byteCodeGenerator, funcInfo);

    EmitThrowOnNotObject(returnReg, byteCodeGenerator);
    funcInfo->ReleaseTmpRegister(returnReg);
    byteCodeGenerator->Writer()->MarkLabel(noReturn);
}